

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Covariance4D.hpp
# Opt level: O2

void __thiscall
Covariance::Covariance4D<Vector,_double>::Projection(Covariance4D<Vector,_double> *this,Vector *n)

{
  Vector *w1;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  Vector *v;
  Vector *w1_00;
  double dVar10;
  double local_50;
  double dStack_48;
  double local_40;
  
  w1 = &this->x;
  dVar1 = Vector::Dot(w1,n);
  dVar2 = Vector::Dot(&this->y,n);
  dVar10 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar10 = atan2(dVar1,dVar2);
  }
  dVar2 = cos(dVar10);
  dVar10 = sin(dVar10);
  Rotate(this,dVar2,-dVar10);
  w1_00 = &this->z;
  dVar3 = Vector::Dot(w1_00,n);
  ScaleY(this,ABS(dVar3));
  dVar1 = (this->y).z;
  dVar5 = (this->x).x * dVar2 - dVar10 * (this->y).x;
  dVar6 = (this->x).y * dVar2 - dVar10 * (this->y).y;
  auVar4._8_4_ = SUB84(dVar6,0);
  auVar4._0_8_ = dVar5;
  auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
  (this->x).x = dVar5;
  (this->x).y = (double)auVar4._8_8_;
  (this->x).z = (this->x).z * dVar2 - dVar1 * dVar10;
  uVar9 = *(uint *)((long)&n->x + 4);
  if (0.0 <= dVar3) {
    dVar1 = n->y;
    dVar2 = n->z;
    *(undefined4 *)&(this->z).x = *(undefined4 *)&n->x;
    *(uint *)((long)&(this->z).x + 4) = uVar9;
    (this->z).y = dVar1;
    (this->z).z = dVar2;
    v = w1;
  }
  else {
    uVar7 = *(undefined4 *)&n->z;
    uVar8 = *(uint *)((long)&n->z + 4);
    dVar1 = n->y;
    *(undefined4 *)&(this->z).x = *(undefined4 *)&n->x;
    *(uint *)((long)&(this->z).x + 4) = uVar9 ^ 0x80000000;
    *(int *)&(this->z).y = SUB84(dVar1,0);
    *(uint *)((long)&(this->z).y + 4) = (uint)((ulong)dVar1 >> 0x20) ^ 0x80000000;
    *(undefined4 *)&(this->z).z = uVar7;
    *(uint *)((long)&(this->z).z + 4) = uVar8 ^ 0x80000000;
    v = w1_00;
    w1_00 = w1;
  }
  Vector::Cross(w1_00,v);
  (this->y).z = local_40;
  (this->y).x = local_50;
  (this->y).y = dStack_48;
  return;
}

Assistant:

inline void Projection(const Vector& n) {

         const auto cx = Vector::Dot(x, n);
         const auto cy = Vector::Dot(y, n);

         // Rotate the Frame to be aligned with plane.
         const Float alpha = (cx != 0.0) ? atan2(cx, cy) : 0.0;
         const Float c = cos(alpha), s = -sin(alpha);
         Rotate(c, s);

         // Scale the componnent that project by the cosine of the ray direction
         // and the normal.
         const Float cosine = Vector::Dot(z, n);
         ScaleY(std::abs(cosine));

         // Update direction vectors.
         x = c*x + s*y;
         z = (cosine < 0.0f) ? -n : n;
         y = (cosine < 0.0f) ?  Vector::Cross(x, z) : Vector::Cross(z, x);
      }